

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_process_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  char *argv [3];
  size_t exepath_size;
  uv_process_options_t options;
  uv_process_t h;
  char exepath [256];
  long lStack_270;
  undefined1 auStack_268 [88];
  code *pcStack_210;
  long local_208;
  long local_200;
  long *local_1f8;
  char *pcStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  long *plStack_1d0;
  undefined8 **local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  long local_180 [13];
  long local_118 [33];
  
  local_1e8 = 0;
  local_1f8 = (long *)0x0;
  pcStack_1f0 = "spawn_helper4";
  local_1d8 = 0;
  plStack_1d0 = (long *)0x0;
  local_1c8 = (long **)0x0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1e0 = 0x100;
  plVar3 = local_118;
  pcStack_210 = (code *)0x1b9f3c;
  iVar1 = uv_exepath(plVar3);
  local_180[0] = (long)iVar1;
  local_208 = 0;
  if (local_180[0] == 0) {
    local_1c8 = &local_1f8;
    local_1d8 = 0;
    pcStack_210 = (code *)0x1b9f7f;
    local_1f8 = plVar3;
    plStack_1d0 = plVar3;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x1b9f92;
    iVar1 = uv_spawn(uVar2,local_180,&local_1d8);
    local_208 = (long)iVar1;
    local_200 = 0;
    plVar3 = (long *)0x0;
    if (local_208 != 0) goto LAB_001ba06f;
    plVar3 = local_180;
    pcStack_210 = (code *)0x1b9fbc;
    uv_unref(plVar3);
    pcStack_210 = (code *)0x1b9fc1;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x1b9fcb;
    uv_run(uVar2,0);
    pcStack_210 = (code *)0x1b9fd8;
    iVar1 = uv_process_kill(plVar3,0xf);
    local_208 = (long)iVar1;
    local_200 = 0;
    if (local_208 != 0) goto LAB_001ba07c;
    pcStack_210 = (code *)0x1ba003;
    do_close(local_180);
    pcStack_210 = (code *)0x1ba008;
    plVar3 = (long *)uv_default_loop();
    pcStack_210 = (code *)0x1ba01c;
    uv_walk(plVar3,close_walk_cb,0);
    pcStack_210 = (code *)0x1ba026;
    uv_run(plVar3,0);
    local_208 = 0;
    pcStack_210 = (code *)0x1ba033;
    uVar2 = uv_default_loop();
    pcStack_210 = (code *)0x1ba03b;
    iVar1 = uv_loop_close(uVar2);
    local_200 = (long)iVar1;
    if (local_208 == local_200) {
      pcStack_210 = (code *)0x1ba052;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_210 = (code *)0x1ba06f;
    run_test_process_ref_cold_1();
LAB_001ba06f:
    pcStack_210 = (code *)0x1ba07c;
    run_test_process_ref_cold_2();
LAB_001ba07c:
    pcStack_210 = (code *)0x1ba089;
    run_test_process_ref_cold_3();
  }
  pcStack_210 = run_test_has_ref;
  run_test_process_ref_cold_4();
  pcStack_210 = (code *)plVar3;
  uVar2 = uv_default_loop();
  uv_idle_init(uVar2,auStack_268);
  uv_ref(auStack_268);
  lStack_270 = 1;
  iVar1 = uv_has_ref(auStack_268);
  if (lStack_270 == iVar1) {
    uv_unref(auStack_268);
    iVar1 = uv_has_ref(auStack_268);
    lStack_270 = (long)iVar1;
    if (lStack_270 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_270 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_270 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba188;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_001ba188:
  plVar3 = &lStack_270;
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT_OK(r);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT_OK(r);

  do_close(&h);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}